

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zt_malloc.c
# Opt level: O2

char * zt_strdup_p(char *string)

{
  uint line;
  char *pcVar1;
  char *new_string;
  
  if (string == (char *)0x0) {
    pcVar1 = "string";
    line = 0x3a;
  }
  else {
    pcVar1 = strdup(string);
    if (pcVar1 != (char *)0x0) {
      return pcVar1;
    }
    pcVar1 = "new_string";
    line = 0x3c;
  }
  _zt_log_assertion(pcVar1,
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/zerotao[P]libzt/src/libzt/zt_malloc.c"
                    ,line,"zt_strdup_p");
  abort();
}

Assistant:

char *
zt_strdup_p(const char *string)
{
    char * volatile new_string = NULL;

    zt_assert_always(string);
    new_string = strdup(string);
    zt_assert_always(new_string);

    return new_string;
}